

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O2

bool __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::CheckSolution(SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ArrayRef<double> *x,ValueMapDbl *duals,ArrayRef<double> *obj,void *p_extra)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  char *__s;
  Error *pEVar4;
  bool bVar5;
  ArrayRef<double> x1;
  string local_2c0;
  string err_msg;
  string msgreal;
  string msgidea;
  vector<double,_std::allocator<double>_> x_back;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ArrayRef<double> local_1a8;
  ArrayRef<double> local_178;
  ArrayRef<double> local_148;
  _Bvector_base<std::allocator<bool>_> local_118;
  ArrayRef<double> local_e8;
  ArrayRef<double> local_b8;
  ArrayRef<double> local_88;
  ArrayRef<double> local_58;
  
  if ((p_extra != (void *)0x0) &&
     (this[7].recomp_fn.super__Function_base._M_functor._M_pod_data[4] != '\x01')) {
    return true;
  }
  msgreal._M_dataplus._M_p = (pointer)&msgreal.field_2;
  msgreal._M_string_length = 0;
  msgidea._M_dataplus._M_p = (pointer)&msgidea.field_2;
  msgidea._M_string_length = 0;
  msgreal.field_2._M_local_buf[0] = '\0';
  msgidea.field_2._M_local_buf[0] = '\0';
  err_msg._M_dataplus._M_p = (pointer)&err_msg.field_2;
  err_msg._M_string_length = 0;
  err_msg.field_2._M_local_buf[0] = '\0';
  ArrayRef::operator_cast_to_vector(&x_back,(ArrayRef *)x);
  uVar1 = *(uint *)&this[7].recomp_fn.super__Function_base._M_functor;
  if ((uVar1 & 0x1f) != 0) {
    local_88.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.data_ = x->data_;
    local_88.size_ = x->size_;
    local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.data_ = obj->data_;
    local_b8.size_ = obj->size_;
    local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.data_ = (double *)0x0;
    local_e8.size_ = 0;
    SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::DoCheckSol_abi_cxx11_((string *)&x1,this,&local_88,duals,&local_b8,&local_e8,&x_back,false);
    std::__cxx11::string::operator=((string *)&msgreal,(string *)&x1);
    std::__cxx11::string::~string((string *)&x1);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_e8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_b8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_88);
    uVar1 = *(uint *)&this[7].recomp_fn.super__Function_base._M_functor;
  }
  if ((uVar1 & 0x3e0) != 0) {
    local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.data_ = x->data_;
    local_58.size_ = x->size_;
    local_118._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_118._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_118._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
    local_118._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_118._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_118._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
    local_118._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    RecomputeAuxVars(&x1,this,&local_58,(vector<bool,_std::allocator<bool>_> *)&local_118);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_118);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_58);
    local_148.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.data_ = x1.data_;
    local_148.size_ = x1.size_;
    local_178.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.data_ = obj->data_;
    local_178.size_ = obj->size_;
    local_1a8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.data_ =
         x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_1a8.size_ =
         (long)x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start >> 3;
    SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::DoCheckSol_abi_cxx11_(&local_2c0,this,&local_148,duals,&local_178,&local_1a8,&x_back,true);
    std::__cxx11::string::operator=((string *)&msgidea,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_1a8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_178);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_148);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&x1);
  }
  if (msgidea._M_string_length != 0 || msgreal._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&x1,"Type                         MaxAbs [Name]   MaxRel [Name]\n",
               (allocator<char> *)&local_2c0);
    std::__cxx11::string::append((string *)&x1);
    if (msgreal._M_string_length != 0) {
      lVar3 = msgreal._M_string_length - 1;
      while (lVar2 = lVar3, lVar3 = lVar2 + -1, lVar2 != 0) {
        if ((msgreal._M_dataplus._M_p[lVar2 + -1] == '\n') &&
           (msgreal._M_dataplus._M_p[lVar2] == ' ')) {
          msgreal._M_dataplus._M_p[lVar2] = '*';
        }
      }
      if (*msgreal._M_dataplus._M_p == ' ') {
        *msgreal._M_dataplus._M_p = '*';
      }
      std::__cxx11::string::append((string *)&x1);
      std::__cxx11::string::append((char *)&x1);
    }
    std::__cxx11::string::append((char *)&x1);
    if (this[7].recomp_fn.super__Function_base._M_functor._M_pod_data[5] == '\x01') {
      pEVar4 = (Error *)__cxa_allocate_exception(0x18);
      std::operator+(&local_2c0,"Solution check failed - reporting as fatal:\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x1);
      Error::Error(pEVar4,(CStringRef)local_2c0._M_dataplus._M_p,0x96);
      __cxa_throw(pEVar4,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    __s = BasicSolver::GetSolCheckWarningKey
                    (*(BasicSolver **)&this[1].recomp_fn.super__Function_base._M_functor,true);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,__s,(allocator<char> *)&local_2c0);
    std::__cxx11::string::string((string *)&local_1e8,(string *)&x1);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddWarning((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)&this[-0x13].recomp_fn.super__Function_base._M_manager,&local_1c8,&local_1e8,
                 true);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&x1);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x_back.super__Vector_base<double,_std::allocator<double>_>);
  if (err_msg._M_string_length == 0) {
    if (msgreal._M_string_length == 0) {
      bVar5 = msgidea._M_string_length == 0;
      goto LAB_00153d60;
    }
  }
  else {
    std::operator+(&local_2c0,'\n',&msgreal);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x1,
                   &local_2c0,&msgidea);
    std::__cxx11::string::append((string *)&err_msg);
    std::__cxx11::string::~string((string *)&x1);
    std::__cxx11::string::~string((string *)&local_2c0);
    if (this[7].recomp_fn.super__Function_base._M_functor._M_pod_data[5] == '\x01') {
      pEVar4 = (Error *)__cxa_allocate_exception(0x18);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x1,
                     "Solution check aborted: ",&err_msg);
      Error::Error(pEVar4,(CStringRef)
                          x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,-1);
      __cxa_throw(pEVar4,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Solution check aborted",(allocator<char> *)&x1);
    std::__cxx11::string::string((string *)&local_228,(string *)&err_msg);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddWarning((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)&this[-0x13].recomp_fn.super__Function_base._M_manager,&local_208,&local_228,
                 false);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
  }
  bVar5 = false;
LAB_00153d60:
  std::__cxx11::string::~string((string *)&err_msg);
  std::__cxx11::string::~string((string *)&msgidea);
  std::__cxx11::string::~string((string *)&msgreal);
  return bVar5;
}

Assistant:

bool CheckSolution(
        ArrayRef<double> x,
        const pre::ValueMapDbl& duals,   // unused
        ArrayRef<double> obj,
        void* p_extra) {
    bool fKnownInfeas = (bool)p_extra;
    if (fKnownInfeas && !MPCD( sol_check_infeas() ))
      return true;
    std::string msgreal, msgidea;
    std::string err_msg;
    try {                            // protect
      std::vector<double> x_back = x;
      if (MPCD( sol_check_mode() ) & (1+2+4+8+16)) {
        msgreal = DoCheckSol(x, duals, obj, {}, x_back, false);
      }
      if (MPCD( sol_check_mode() ) & (32+64+128+256+512)) {
        auto x1 = RecomputeAuxVars(x);
        msgidea = DoCheckSol(x1, duals, obj, x_back, x_back, true);
      }
      if (msgreal.size() || msgidea.size()) {     // Checks failed
        std::string warn
            = "Type                         MaxAbs [Name]   MaxRel [Name]\n";
        warn += msgidea;
        if (msgreal.size()) {
          for (auto i=msgreal.size()-1; i--; ) {
            if ('\n'==msgreal[i] && ' '==msgreal[i+1])
              msgreal[i+1] = '*';
          }
          if (' '==msgreal.front())
            msgreal.front() = '*';
          warn += msgreal;
          warn += "*: Using the solver's aux variable values.\n";
        }
        warn += "Documentation: mp.ampl.com/modeling-tools.html#automatic-solution-check.";
        // Should messages for realistic and idealistic
        // modes be more coordinated?
        // I.e., when no expressions.
        // What if this is an intermediate solution?
        // Should be fine - warning by default,
        // fail if requested explicitly.
        // If warning, we should add the report
        // to that solution's solve message, and
        // a summary in the final solve message.
        // For now, do this via warnings?
        if (MPCD( sol_check_fail() ))
          MP_RAISE_WITH_CODE(int(sol::MP_SOLUTION_CHECK),
                             "Solution check failed - reporting as fatal:\n"
                             + warn);
        else
          MPD( AddWarning(
                 MPD( GetEnv() ).GetSolCheckWarningKey(true),
                 warn,
                 true) );  // replace for multiple solutions
      }
    } catch (const mp::Error& err) {
      if (MPCD( sol_check_fail() ))
        throw;
      err_msg = err.what();
    } catch (const std::exception& exc) {
      err_msg = exc.what();
    } catch (...) {
      err_msg = "unknown error";
    }
    if (err_msg.size()) {
      err_msg += '\n' + msgreal + msgidea;
      if (MPCD( sol_check_fail() ))
        MP_RAISE("Solution check aborted: " + err_msg);
      MPD( AddWarning("Solution check aborted", err_msg) );
      return false;
    }
    return msgreal.empty() && msgidea.empty();
  }